

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v10::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  basic_fp<unsigned___int128> value_00;
  convert_float_result<double> cVar1;
  type tVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  uint uVar7;
  char *pcVar8;
  unsigned_long uVar9;
  ulong uVar10;
  carrier_uint cVar11;
  uint64_t uVar12;
  bool bVar13;
  uint128_fallback y;
  decimal_fp<double> dVar14;
  bool local_1f1;
  byte local_1e7;
  byte local_1e6;
  byte local_1e5;
  bool local_1dd;
  byte local_1d7;
  byte local_1d6;
  byte local_1d5;
  bool local_1cd;
  int local_1c8;
  size_t local_190;
  size_t num_digits;
  int max_double_digits;
  bool is_predecessor_closer;
  basic_fp<unsigned___int128> f;
  int i;
  uint32_t fractional_part_1;
  uint32_t third_subsegment;
  uint32_t second_subsegment;
  uint32_t fractional_part;
  anon_class_24_3_5eee03a8 print_subsegment;
  bool local_fd;
  int number_of_digits_to_print;
  uint uStack_f8;
  bool should_round_up;
  uint32_t digits;
  uint64_t prod;
  uint64_t second_third_subsegments;
  undefined1 auStack_e0 [4];
  uint32_t first_subsegment;
  uint64_t local_d8;
  undefined1 local_d0 [8];
  uint128_fallback r;
  int digits_in_the_first_segment;
  bool has_more_segments;
  uint64_t first_segment;
  int beta;
  int k;
  int shift;
  int exponent;
  uint64_t significand;
  uint64_t significand_mask;
  unsigned_long local_88;
  unsigned_long br;
  appender local_78;
  unsigned_long local_70;
  decimal_fp<double> dec;
  appender local_58;
  decimal_fp<float> local_50;
  decimal_fp<float> dec_1;
  uint dragon_flags;
  char local_3a;
  bool use_dragon;
  int exp;
  bool fixed;
  convert_float_result<double> converted_value;
  buffer<char> *buf_local;
  double dStack_20;
  int precision_local;
  double value_local;
  uint uStack_10;
  float_specs specs_local;
  
  converted_value = (convert_float_result<double>)buf;
  buf_local._4_4_ = precision;
  dStack_20 = value;
  unique0x10000781 = specs;
  if (value < 0.0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Optiroc[P]SuperFamiconv/include/fmt/format.h"
                ,0xcd2,"value is negative");
  }
  _exp = convert_float<double>(value);
  cVar1 = converted_value;
  use_dragon = value_local._8_1_ == '\x02';
  if (0.0 < dStack_20) {
    dragon_flags = 0;
    dec_1.exponent._3_1_ = 1;
    dec_1.significand = 0;
    if (buf_local._4_4_ < 0) {
      if ((uStack_10 >> 0x12 & 1) == 0) {
        dVar14 = dragonbox::to_decimal<double>(dStack_20);
        local_70 = dVar14.significand;
        dec.significand._0_4_ = dVar14.exponent;
        appender::back_insert_iterator(&local_78,(buffer<char> *)converted_value);
        write<char,_fmt::v10::appender,_unsigned_long,_0>(local_78,local_70);
        specs_local.precision = (int)dec.significand;
      }
      else {
        local_50 = dragonbox::to_decimal<float>((float)dStack_20);
        appender::back_insert_iterator(&local_58,(buffer<char> *)converted_value);
        write<char,_fmt::v10::appender,_unsigned_int,_0>(local_58,local_50.significand);
        specs_local.precision = local_50.exponent;
      }
    }
    else {
      significand_mask = (uint64_t)dStack_20;
      uVar9 = bit_cast<unsigned_long,_double,_0>((double *)&significand_mask);
      uVar10 = uVar9 & 0xfffffffffffff;
      local_88 = uVar9;
      cVar11 = exponent_mask<double>();
      iVar3 = num_significand_bits<double>();
      iVar3 = (int)((uVar9 & cVar11) >> ((byte)iVar3 & 0x3f));
      if (iVar3 == 0) {
        if (uVar10 == 0) {
          assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Optiroc[P]SuperFamiconv/include/fmt/format.h"
                      ,0xd0b,"zeros should not appear here");
        }
        iVar5 = countl_zero(uVar10);
        iVar3 = num_bits<unsigned_long>();
        iVar4 = num_significand_bits<double>();
        if (iVar5 < iVar3 - iVar4) {
          assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Optiroc[P]SuperFamiconv/include/fmt/format.h"
                      ,0xd0e,"");
        }
        iVar3 = num_bits<unsigned_long>();
        iVar4 = num_significand_bits<double>();
        iVar5 = iVar5 - ((iVar3 - iVar4) + -2);
        iVar3 = num_significand_bits<double>();
        k = (-0x3fd - iVar3) - iVar5;
        _shift = uVar10 << ((byte)iVar5 & 0x3f);
      }
      else {
        iVar4 = exponent_bias<double>();
        iVar5 = num_significand_bits<double>();
        k = iVar3 - (iVar4 + iVar5);
        iVar3 = num_significand_bits<double>();
        _shift = (1L << ((byte)iVar3 & 0x3f) | uVar10) << 1;
      }
      iVar3 = dragonbox::floor_log10_pow2(k);
      iVar3 = 2 - iVar3;
      dragon_flags = -iVar3;
      iVar4 = dragonbox::floor_log2_pow10(iVar3);
      uVar10 = (ulong)(uint)(k + iVar4);
      _auStack_e0 = dragonbox::get_cached_power(iVar3);
      y.hi_ = uVar10;
      y.lo_ = local_d8;
      _local_d0 = dragonbox::umul192_upper128
                            ((dragonbox *)(_shift << ((byte)(k + iVar4) & 0x3f)),_auStack_e0,y);
      _digits_in_the_first_segment = uint128_fallback::high((uint128_fallback *)local_d0);
      uVar12 = uint128_fallback::low((uint128_fallback *)local_d0);
      r.hi_._7_1_ = uVar12 != 0;
      if (_digits_in_the_first_segment < 1000000000000000000) {
        r.hi_._0_4_ = 0x12;
        _digits_in_the_first_segment = _digits_in_the_first_segment * 10;
      }
      else {
        r.hi_._0_4_ = 0x13;
      }
      if ((use_dragon & 1U) != 0) {
        adjust_precision((int *)((long)&buf_local + 4),dragon_flags + (int)r.hi_);
      }
      if (buf_local._4_4_ < (int)r.hi_) {
        dec_1.exponent._3_1_ = 0;
        if (buf_local._4_4_ < 1) {
          dragon_flags = (int)r.hi_ + dragon_flags;
          if (buf_local._4_4_ < 0) {
            buffer<char>::try_resize((buffer<char> *)converted_value,0);
          }
          else {
            buffer<char>::try_resize((buffer<char> *)converted_value,1);
            if ((_digits_in_the_first_segment | r.hi_._7_1_ & 1) < 0x4563918244f40001) {
              pcVar8 = buffer<char>::operator[]<int>((buffer<char> *)converted_value,0);
              *pcVar8 = '0';
            }
            else {
              pcVar8 = buffer<char>::operator[]<int>((buffer<char> *)converted_value,0);
              *pcVar8 = '1';
            }
          }
        }
        else {
          dragon_flags = ((int)r.hi_ - buf_local._4_4_) + dragon_flags;
          uVar12 = dragonbox::umul128_upper64(_digits_in_the_first_segment,0x6df37f675ef6eae0);
          uVar7 = (uint)(uVar12 >> 0x20);
          prod = _digits_in_the_first_segment + (ulong)uVar7 * -10000000000;
          if (buf_local._4_4_ < 10) {
            local_1c8 = buf_local._4_4_;
          }
          else {
            local_1c8 = 9;
          }
          print_subsegment.digits._4_4_ = local_1c8;
          _second_subsegment = (int *)((long)&print_subsegment.digits + 4);
          print_subsegment.number_of_digits_to_print = (int *)&stack0xffffffffffffff08;
          print_subsegment.prod = (uint64_t *)&number_of_digits_to_print;
          second_third_subsegments._4_4_ = uVar7;
          pcVar8 = buffer<char>::data((buffer<char> *)converted_value);
          format_float<double>::anon_class_24_3_5eee03a8::operator()
                    ((anon_class_24_3_5eee03a8 *)&second_subsegment,uVar7,pcVar8);
          if (buf_local._4_4_ < 10) {
            if (buf_local._4_4_ < 9) {
              uVar6 = fractional_part_rounding_thresholds(8 - print_subsegment.digits._4_4_);
              local_1cd = true;
              if (uStack_f8 < uVar6) {
                local_1cd = (uStack_f8 >> 0x1f &
                            (number_of_digits_to_print & 1U | (uint)(prod != 0) |
                            (uint)(r.hi_._7_1_ & 1))) != 0;
              }
              local_fd = local_1cd;
            }
            else {
              local_1d5 = 1;
              if (prod < 0x12a05f201) {
                local_1d6 = 0;
                if (prod == 5000000000) {
                  local_1d7 = 1;
                  if ((number_of_digits_to_print & 1U) == 0) {
                    local_1d7 = r.hi_._7_1_;
                  }
                  local_1d6 = local_1d7;
                }
                local_1d5 = local_1d6;
              }
              local_fd = (bool)(local_1d5 & 1);
            }
          }
          else {
            uVar12 = dragonbox::umul128_upper64(prod,0x199999999999999a);
            uVar7 = (int)prod + (uint32_t)uVar12 * -10;
            print_subsegment.digits._4_4_ = buf_local._4_4_ + -9;
            pcVar8 = buffer<char>::data((buffer<char> *)converted_value);
            format_float<double>::anon_class_24_3_5eee03a8::operator()
                      ((anon_class_24_3_5eee03a8 *)&second_subsegment,(uint32_t)uVar12,pcVar8 + 9);
            if (buf_local._4_4_ < 0x12) {
              uVar6 = fractional_part_rounding_thresholds(8 - print_subsegment.digits._4_4_);
              local_1dd = true;
              if (uStack_f8 < uVar6) {
                local_1dd = (uStack_f8 >> 0x1f &
                            (number_of_digits_to_print & 1U | (uint)(uVar7 != 0) |
                            (uint)(r.hi_._7_1_ & 1))) != 0;
              }
              local_fd = local_1dd;
            }
            else {
              local_1e5 = 1;
              if (uVar7 < 6) {
                local_1e6 = 0;
                if (uVar7 == 5) {
                  local_1e7 = 1;
                  if ((number_of_digits_to_print & 1U) == 0) {
                    local_1e7 = r.hi_._7_1_;
                  }
                  local_1e6 = local_1e7;
                }
                local_1e5 = local_1e6;
              }
              local_fd = (bool)(local_1e5 & 1);
            }
          }
          if (local_fd != false) {
            pcVar8 = buffer<char>::operator[]<int>
                               ((buffer<char> *)converted_value,buf_local._4_4_ + -1);
            *pcVar8 = *pcVar8 + '\x01';
            f._28_4_ = buf_local._4_4_;
            while( true ) {
              f._28_4_ = f._28_4_ + -1;
              bVar13 = false;
              if (0 < (int)f._28_4_) {
                pcVar8 = buffer<char>::operator[]<int>((buffer<char> *)converted_value,f._28_4_);
                bVar13 = '9' < *pcVar8;
              }
              if (!bVar13) break;
              pcVar8 = buffer<char>::operator[]<int>((buffer<char> *)converted_value,f._28_4_);
              *pcVar8 = '0';
              pcVar8 = buffer<char>::operator[]<int>((buffer<char> *)converted_value,f._28_4_ + -1);
              *pcVar8 = *pcVar8 + '\x01';
            }
            pcVar8 = buffer<char>::operator[]<int>((buffer<char> *)converted_value,0);
            if ('9' < *pcVar8) {
              pcVar8 = buffer<char>::operator[]<int>((buffer<char> *)converted_value,0);
              iVar3 = buf_local._4_4_;
              *pcVar8 = '1';
              if ((use_dragon & 1U) == 0) {
                dragon_flags = dragon_flags + 1;
              }
              else {
                buf_local._4_4_ = buf_local._4_4_ + 1;
                pcVar8 = buffer<char>::operator[]<int>((buffer<char> *)converted_value,iVar3);
                *pcVar8 = '0';
              }
            }
          }
          cVar1 = converted_value;
          tVar2 = to_unsigned<int>(buf_local._4_4_);
          buffer<char>::try_resize((buffer<char> *)cVar1,(ulong)tVar2);
        }
      }
      else {
        dragon_flags = (int)r.hi_ + -1 + dragon_flags;
      }
      if ((dec_1.exponent._3_1_ & 1) != 0) {
        basic_fp<unsigned___int128>::basic_fp((basic_fp<unsigned___int128> *)&max_double_digits);
        if ((uStack_10 >> 0x12 & 1) == 0) {
          local_1f1 = basic_fp<unsigned___int128>::assign<double,_0>
                                ((basic_fp<unsigned___int128> *)&max_double_digits,_exp);
        }
        else {
          local_1f1 = basic_fp<unsigned___int128>::assign<float,_0>
                                ((basic_fp<unsigned___int128> *)&max_double_digits,(float)dStack_20)
          ;
        }
        if (local_1f1 != false) {
          dec_1.significand = dec_1.significand | 1;
        }
        if ((use_dragon & 1U) != 0) {
          dec_1.significand = dec_1.significand | 4;
        }
        if (0x2ff < buf_local._4_4_) {
          buf_local._4_4_ = 0x2ff;
        }
        value_00.f._8_8_ = (undefined8)f.f;
        value_00.f._0_8_ = _max_double_digits;
        value_00._16_8_ = f.f._8_8_;
        value_00._24_4_ = f.e;
        value_00._28_4_ = f._20_4_;
        format_dragon(value_00,dec_1.significand,buf_local._4_4_,(buffer<char> *)converted_value,
                      (int *)&dragon_flags);
      }
      if (((use_dragon & 1U) == 0) && ((uStack_10 >> 0x13 & 1) == 0)) {
        local_190 = buffer<char>::size((buffer<char> *)converted_value);
        while( true ) {
          bVar13 = false;
          if (local_190 != 0) {
            pcVar8 = buffer<char>::operator[]<unsigned_long>
                               ((buffer<char> *)converted_value,local_190 - 1);
            bVar13 = *pcVar8 == '0';
          }
          if (!bVar13) break;
          local_190 = local_190 - 1;
          dragon_flags = dragon_flags + 1;
        }
        buffer<char>::try_resize((buffer<char> *)converted_value,local_190);
      }
      specs_local.precision = dragon_flags;
    }
  }
  else if ((buf_local._4_4_ < 1) || (!use_dragon)) {
    local_3a = '0';
    buffer<char>::push_back((buffer<char> *)converted_value,&local_3a);
    specs_local.precision = 0;
  }
  else {
    tVar2 = to_unsigned<int>(buf_local._4_4_);
    buffer<char>::try_resize((buffer<char> *)cVar1,(ulong)tVar2);
    pcVar8 = buffer<char>::data((buffer<char> *)converted_value);
    fill_n<char,int>(pcVar8,buf_local._4_4_,'0');
    specs_local.precision = -buf_local._4_4_;
  }
  return specs_local.precision;
}

Assistant:

FMT_CONSTEXPR20 auto format_float(Float value, int precision, float_specs specs,
                                  buffer<char>& buf) -> int {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");
  auto converted_value = convert_float(value);

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  int exp = 0;
  bool use_dragon = true;
  unsigned dragon_flags = 0;
  if (!is_fast_float<Float>() || is_constant_evaluated()) {
    const auto inv_log2_10 = 0.3010299956639812;  // 1 / log2(10)
    using info = dragonbox::float_info<decltype(converted_value)>;
    const auto f = basic_fp<typename info::carrier_uint>(converted_value);
    // Compute exp, an approximate power of 10, such that
    //   10^(exp - 1) <= value < 10^exp or 10^exp <= value < 10^(exp + 1).
    // This is based on log10(value) == log2(value) / log2(10) and approximation
    // of log2(value) by e + num_fraction_bits idea from double-conversion.
    auto e = (f.e + count_digits<1>(f.f) - 1) * inv_log2_10 - 1e-10;
    exp = static_cast<int>(e);
    if (e > exp) ++exp;  // Compute ceil.
    dragon_flags = dragon::fixup;
  } else if (precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  } else {
    // Extract significand bits and exponent bits.
    using info = dragonbox::float_info<double>;
    auto br = bit_cast<uint64_t>(static_cast<double>(value));

    const uint64_t significand_mask =
        (static_cast<uint64_t>(1) << num_significand_bits<double>()) - 1;
    uint64_t significand = (br & significand_mask);
    int exponent = static_cast<int>((br & exponent_mask<double>()) >>
                                    num_significand_bits<double>());

    if (exponent != 0) {  // Check if normal.
      exponent -= exponent_bias<double>() + num_significand_bits<double>();
      significand |=
          (static_cast<uint64_t>(1) << num_significand_bits<double>());
      significand <<= 1;
    } else {
      // Normalize subnormal inputs.
      FMT_ASSERT(significand != 0, "zeros should not appear here");
      int shift = countl_zero(significand);
      FMT_ASSERT(shift >= num_bits<uint64_t>() - num_significand_bits<double>(),
                 "");
      shift -= (num_bits<uint64_t>() - num_significand_bits<double>() - 2);
      exponent = (std::numeric_limits<double>::min_exponent -
                  num_significand_bits<double>()) -
                 shift;
      significand <<= shift;
    }

    // Compute the first several nonzero decimal significand digits.
    // We call the number we get the first segment.
    const int k = info::kappa - dragonbox::floor_log10_pow2(exponent);
    exp = -k;
    const int beta = exponent + dragonbox::floor_log2_pow10(k);
    uint64_t first_segment;
    bool has_more_segments;
    int digits_in_the_first_segment;
    {
      const auto r = dragonbox::umul192_upper128(
          significand << beta, dragonbox::get_cached_power(k));
      first_segment = r.high();
      has_more_segments = r.low() != 0;

      // The first segment can have 18 ~ 19 digits.
      if (first_segment >= 1000000000000000000ULL) {
        digits_in_the_first_segment = 19;
      } else {
        // When it is of 18-digits, we align it to 19-digits by adding a bogus
        // zero at the end.
        digits_in_the_first_segment = 18;
        first_segment *= 10;
      }
    }

    // Compute the actual number of decimal digits to print.
    if (fixed) adjust_precision(precision, exp + digits_in_the_first_segment);

    // Use Dragon4 only when there might be not enough digits in the first
    // segment.
    if (digits_in_the_first_segment > precision) {
      use_dragon = false;

      if (precision <= 0) {
        exp += digits_in_the_first_segment;

        if (precision < 0) {
          // Nothing to do, since all we have are just leading zeros.
          buf.try_resize(0);
        } else {
          // We may need to round-up.
          buf.try_resize(1);
          if ((first_segment | static_cast<uint64_t>(has_more_segments)) >
              5000000000000000000ULL) {
            buf[0] = '1';
          } else {
            buf[0] = '0';
          }
        }
      }  // precision <= 0
      else {
        exp += digits_in_the_first_segment - precision;

        // When precision > 0, we divide the first segment into three
        // subsegments, each with 9, 9, and 0 ~ 1 digits so that each fits
        // in 32-bits which usually allows faster calculation than in
        // 64-bits. Since some compiler (e.g. MSVC) doesn't know how to optimize
        // division-by-constant for large 64-bit divisors, we do it here
        // manually. The magic number 7922816251426433760 below is equal to
        // ceil(2^(64+32) / 10^10).
        const uint32_t first_subsegment = static_cast<uint32_t>(
            dragonbox::umul128_upper64(first_segment, 7922816251426433760ULL) >>
            32);
        const uint64_t second_third_subsegments =
            first_segment - first_subsegment * 10000000000ULL;

        uint64_t prod;
        uint32_t digits;
        bool should_round_up;
        int number_of_digits_to_print = precision > 9 ? 9 : precision;

        // Print a 9-digits subsegment, either the first or the second.
        auto print_subsegment = [&](uint32_t subsegment, char* buffer) {
          int number_of_digits_printed = 0;

          // If we want to print an odd number of digits from the subsegment,
          if ((number_of_digits_to_print & 1) != 0) {
            // Convert to 64-bit fixed-point fractional form with 1-digit
            // integer part. The magic number 720575941 is a good enough
            // approximation of 2^(32 + 24) / 10^8; see
            // https://jk-jeon.github.io/posts/2022/12/fixed-precision-formatting/#fixed-length-case
            // for details.
            prod = ((subsegment * static_cast<uint64_t>(720575941)) >> 24) + 1;
            digits = static_cast<uint32_t>(prod >> 32);
            *buffer = static_cast<char>('0' + digits);
            number_of_digits_printed++;
          }
          // If we want to print an even number of digits from the
          // first_subsegment,
          else {
            // Convert to 64-bit fixed-point fractional form with 2-digits
            // integer part. The magic number 450359963 is a good enough
            // approximation of 2^(32 + 20) / 10^7; see
            // https://jk-jeon.github.io/posts/2022/12/fixed-precision-formatting/#fixed-length-case
            // for details.
            prod = ((subsegment * static_cast<uint64_t>(450359963)) >> 20) + 1;
            digits = static_cast<uint32_t>(prod >> 32);
            copy2(buffer, digits2(digits));
            number_of_digits_printed += 2;
          }

          // Print all digit pairs.
          while (number_of_digits_printed < number_of_digits_to_print) {
            prod = static_cast<uint32_t>(prod) * static_cast<uint64_t>(100);
            digits = static_cast<uint32_t>(prod >> 32);
            copy2(buffer + number_of_digits_printed, digits2(digits));
            number_of_digits_printed += 2;
          }
        };

        // Print first subsegment.
        print_subsegment(first_subsegment, buf.data());

        // Perform rounding if the first subsegment is the last subsegment to
        // print.
        if (precision <= 9) {
          // Rounding inside the subsegment.
          // We round-up if:
          //  - either the fractional part is strictly larger than 1/2, or
          //  - the fractional part is exactly 1/2 and the last digit is odd.
          // We rely on the following observations:
          //  - If fractional_part >= threshold, then the fractional part is
          //    strictly larger than 1/2.
          //  - If the MSB of fractional_part is set, then the fractional part
          //    must be at least 1/2.
          //  - When the MSB of fractional_part is set, either
          //    second_third_subsegments being nonzero or has_more_segments
          //    being true means there are further digits not printed, so the
          //    fractional part is strictly larger than 1/2.
          if (precision < 9) {
            uint32_t fractional_part = static_cast<uint32_t>(prod);
            should_round_up =
                fractional_part >= fractional_part_rounding_thresholds(
                                       8 - number_of_digits_to_print) ||
                ((fractional_part >> 31) &
                 ((digits & 1) | (second_third_subsegments != 0) |
                  has_more_segments)) != 0;
          }
          // Rounding at the subsegment boundary.
          // In this case, the fractional part is at least 1/2 if and only if
          // second_third_subsegments >= 5000000000ULL, and is strictly larger
          // than 1/2 if we further have either second_third_subsegments >
          // 5000000000ULL or has_more_segments == true.
          else {
            should_round_up = second_third_subsegments > 5000000000ULL ||
                              (second_third_subsegments == 5000000000ULL &&
                               ((digits & 1) != 0 || has_more_segments));
          }
        }
        // Otherwise, print the second subsegment.
        else {
          // Compilers are not aware of how to leverage the maximum value of
          // second_third_subsegments to find out a better magic number which
          // allows us to eliminate an additional shift. 1844674407370955162 =
          // ceil(2^64/10) < ceil(2^64*(10^9/(10^10 - 1))).
          const uint32_t second_subsegment =
              static_cast<uint32_t>(dragonbox::umul128_upper64(
                  second_third_subsegments, 1844674407370955162ULL));
          const uint32_t third_subsegment =
              static_cast<uint32_t>(second_third_subsegments) -
              second_subsegment * 10;

          number_of_digits_to_print = precision - 9;
          print_subsegment(second_subsegment, buf.data() + 9);

          // Rounding inside the subsegment.
          if (precision < 18) {
            // The condition third_subsegment != 0 implies that the segment was
            // of 19 digits, so in this case the third segment should be
            // consisting of a genuine digit from the input.
            uint32_t fractional_part = static_cast<uint32_t>(prod);
            should_round_up =
                fractional_part >= fractional_part_rounding_thresholds(
                                       8 - number_of_digits_to_print) ||
                ((fractional_part >> 31) &
                 ((digits & 1) | (third_subsegment != 0) |
                  has_more_segments)) != 0;
          }
          // Rounding at the subsegment boundary.
          else {
            // In this case, the segment must be of 19 digits, thus
            // the third subsegment should be consisting of a genuine digit from
            // the input.
            should_round_up = third_subsegment > 5 ||
                              (third_subsegment == 5 &&
                               ((digits & 1) != 0 || has_more_segments));
          }
        }

        // Round-up if necessary.
        if (should_round_up) {
          ++buf[precision - 1];
          for (int i = precision - 1; i > 0 && buf[i] > '9'; --i) {
            buf[i] = '0';
            ++buf[i - 1];
          }
          if (buf[0] > '9') {
            buf[0] = '1';
            if (fixed)
              buf[precision++] = '0';
            else
              ++exp;
          }
        }
        buf.try_resize(to_unsigned(precision));
      }
    }  // if (digits_in_the_first_segment > precision)
    else {
      // Adjust the exponent for its use in Dragon4.
      exp += digits_in_the_first_segment - 1;
    }
  }
  if (use_dragon) {
    auto f = basic_fp<uint128_t>();
    bool is_predecessor_closer = specs.binary32
                                     ? f.assign(static_cast<float>(value))
                                     : f.assign(converted_value);
    if (is_predecessor_closer) dragon_flags |= dragon::predecessor_closer;
    if (fixed) dragon_flags |= dragon::fixed;
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, dragon_flags, precision, buf, exp);
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}